

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall Catch::RunContext::testForMissingAssertions(RunContext *this,Counts *assertions)

{
  size_t *psVar1;
  bool bVar2;
  int iVar3;
  
  if (assertions->failed + assertions->passed == 0) {
    iVar3 = (*(((this->m_config).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[9])();
    if (((char)iVar3 == '\0') ||
       ((((this->m_testCaseTracker).nullableValue)->m_currentSection->m_children)._M_t._M_impl.
        super__Rb_tree_header._M_node_count != 0)) {
      bVar2 = false;
    }
    else {
      psVar1 = &(this->m_totals).assertions.failed;
      *psVar1 = *psVar1 + 1;
      assertions->failed = assertions->failed + 1;
      bVar2 = true;
    }
    return bVar2;
  }
  return false;
}

Assistant:

std::size_t total() const {
            return passed + failed;
        }